

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void send_ssi_file(mg_connection *nc,char *path,FILE *fp,int include_level,mg_serve_http_opts *opts)

{
  undefined1 *puVar1;
  long lVar2;
  mg_serve_http_opts *opts_00;
  int iVar3;
  int iVar4;
  long lVar5;
  FILE *__stream;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  undefined1 auStack_4258 [12];
  int local_424c;
  mg_serve_http_opts *local_4248;
  char *local_4240;
  char local_4238 [510];
  char acStack_403a [2];
  char buf [8192];
  char file_name [8192];
  
  if (10 < include_level) {
    mg_printf(nc,"SSI #include level is too deep (%s)");
    return;
  }
  local_424c = include_level + 1;
  local_4248 = opts;
  local_4240 = path;
LAB_00111fc2:
  do {
    iVar4 = 0;
    bVar9 = false;
LAB_00111fc8:
    do {
      while( true ) {
        iVar3 = fgetc((FILE *)fp);
        if (iVar3 == -1) {
          if (0 < iVar4) {
            mg_send(nc,buf,iVar4);
          }
          return;
        }
        lVar5 = (long)iVar4;
        if (iVar3 != 0x3e || !bVar9) break;
        if ((acStack_403a[lVar5 + 1] == '-') && (acStack_403a[lVar5] == '-')) {
          lVar5 = lVar5 + -2;
          do {
            buf[lVar5] = '\0';
            if (lVar5 == 1) break;
            lVar2 = lVar5 + 1;
            lVar5 = lVar5 + -1;
          } while (acStack_403a[lVar2] == ' ');
          iVar4 = bcmp(buf + 5,"include",7);
          if (iVar4 == 0) {
            pcVar7 = buf + 0xd;
            iVar4 = __isoc99_sscanf(pcVar7," virtual=\"%[^\"]\"",file_name);
            if (iVar4 == 1) {
              snprintf(local_4238,500,"%s/%s",local_4248->document_root,file_name);
            }
            else {
              iVar4 = __isoc99_sscanf(pcVar7," abspath=\"%[^\"]\"",file_name);
              if (iVar4 == 1) {
                sVar8 = 500;
                puVar1 = auStack_4258;
              }
              else {
                iVar4 = __isoc99_sscanf(pcVar7," file=\"%[^\"]\"",file_name);
                if ((iVar4 != 1) &&
                   (iVar4 = __isoc99_sscanf(pcVar7," \"%[^\"]\"",file_name), iVar4 != 1)) {
                  mg_printf(nc,"Bad SSI #include: [%s]",pcVar7);
                  goto LAB_00111fc2;
                }
                snprintf(local_4238,500,"%s",local_4240);
                pcVar7 = strrchr(local_4238,0x2f);
                if (pcVar7 != (char *)0x0) {
                  pcVar7[1] = '\0';
                }
                sVar8 = strlen(local_4238);
                puVar1 = auStack_4258 + sVar8;
                sVar8 = 500 - sVar8;
              }
              snprintf(puVar1 + 0x20,sVar8,"%s",file_name);
            }
            __stream = fopen64(local_4238,"rb");
            if (__stream == (FILE *)0x0) {
              piVar6 = __errno_location();
              pcVar7 = strerror(*piVar6);
              mg_printf(nc,"SSI include error: fopen(%s): %s",local_4238,pcVar7);
            }
            else {
              iVar4 = fileno(__stream);
              mg_set_close_on_exec(iVar4);
              opts_00 = local_4248;
              pcVar7 = local_4248->ssi_pattern;
              sVar8 = strlen(pcVar7);
              iVar4 = mg_match_prefix(pcVar7,(int)sVar8,local_4238);
              if (iVar4 < 1) {
                send_file_data(nc,(FILE *)__stream);
              }
              else {
                send_ssi_file(nc,local_4238,(FILE *)__stream,local_424c,opts_00);
              }
              fclose(__stream);
            }
            goto LAB_00111fc2;
          }
          if (buf._5_4_ == 0x6c6c6163) {
            iVar4 = 0;
            mg_call(nc,(mg_event_handler_t)0x0,0x69,buf + 10);
            bVar9 = false;
          }
          else {
            iVar4 = 0;
            bVar9 = false;
            if (buf._5_4_ == 0x63657865) {
              do_ssi_exec(nc,buf + 10);
              goto LAB_00111fc2;
            }
          }
        }
        else {
LAB_001120be:
          if (iVar4 == 0x1ffe) {
            iVar4 = 0;
            mg_printf(nc,"%s: SSI tag is too large",local_4240);
            bVar9 = true;
          }
          else {
            bVar9 = true;
            if (iVar4 == 5) {
              iVar4 = bcmp(buf,"<!--#",5);
              bVar9 = iVar4 == 0;
              iVar4 = 5;
            }
          }
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + 1;
          buf[lVar5] = (char)iVar3;
        }
      }
      if (iVar3 == 0x3c) {
        if (0 < iVar4) {
          mg_send(nc,buf,iVar4);
        }
        buf[0] = '<';
        bVar9 = true;
        iVar4 = 1;
        goto LAB_00111fc8;
      }
      if (bVar9) goto LAB_001120be;
      iVar4 = iVar4 + 1;
      buf[lVar5] = (char)iVar3;
      bVar9 = false;
    } while (iVar4 != 0x2000);
    mg_send(nc,buf,0x2000);
  } while( true );
}

Assistant:

static void send_ssi_file(struct mg_connection *nc, const char *path, FILE *fp,
                          int include_level,
                          const struct mg_serve_http_opts *opts) {
    static const struct mg_str btag = MG_STR("<!--#");
    static const struct mg_str d_include = MG_STR("include");
    static const struct mg_str d_call = MG_STR("call");
#ifndef MG_DISABLE_POPEN
    static const struct mg_str d_exec = MG_STR("exec");
#endif
    char buf[BUFSIZ], *p = buf + btag.len; /* p points to SSI directive */
    int ch, offset, len, in_ssi_tag;

    if (include_level > 10) {
        mg_printf(nc, "SSI #include level is too deep (%s)", path);
        return;
    }

    in_ssi_tag = len = offset = 0;
    while ((ch = fgetc(fp)) != EOF) {
        if (in_ssi_tag && ch == '>' && buf[len - 1] == '-' && buf[len - 2] == '-') {
            size_t i = len - 2;
            in_ssi_tag = 0;

            /* Trim closing --> */
            buf[i--] = '\0';
            while (i > 0 && buf[i] == ' ') {
                buf[i--] = '\0';
            }

            /* Handle known SSI directives */
            if (memcmp(p, d_include.p, d_include.len) == 0) {
                do_ssi_include(nc, path, p + d_include.len + 1, include_level, opts);
            } else if (memcmp(p, d_call.p, d_call.len) == 0) {
                do_ssi_call(nc, p + d_call.len + 1);
#ifndef MG_DISABLE_POPEN
            } else if (memcmp(p, d_exec.p, d_exec.len) == 0) {
                do_ssi_exec(nc, p + d_exec.len + 1);
#endif
            } else {
                /* Silently ignore unknown SSI directive. */
            }
            len = 0;
        } else if (ch == '<') {
            in_ssi_tag = 1;
            if (len > 0) {
                mg_send(nc, buf, (size_t) len);
            }
            len = 0;
            buf[len++] = ch & 0xff;
        } else if (in_ssi_tag) {
            if (len == (int) btag.len && memcmp(buf, btag.p, btag.len) != 0) {
                /* Not an SSI tag */
                in_ssi_tag = 0;
            } else if (len == (int) sizeof(buf) - 2) {
                mg_printf(nc, "%s: SSI tag is too large", path);
                len = 0;
            }
            buf[len++] = ch & 0xff;
        } else {
            buf[len++] = ch & 0xff;
            if (len == (int) sizeof(buf)) {
                mg_send(nc, buf, (size_t) len);
                len = 0;
            }
        }
    }

    /* Send the rest of buffered data */
    if (len > 0) {
        mg_send(nc, buf, (size_t) len);
    }
}